

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O0

void testwin4(wins *wins_ar,int ar_len)

{
  char *local_128;
  undefined4 local_120;
  undefined4 local_118;
  Am_Style *local_110;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  Am_Style *local_b8;
  Am_Drawonable *local_b0;
  undefined1 *local_a8;
  Am_Drawonable *local_a0;
  char local_98 [8];
  char new_title [100];
  Am_Style local_20 [8];
  int local_18;
  int local_14;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  local_14 = ar_len;
  _i = wins_ar;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_b0 = _i[local_18].root;
    local_b8 = local_20;
    Am_Style::Am_Style(local_b8,(Am_Style *)&blue);
    local_110 = local_b8;
    local_128 = "D4 Icon";
    local_c0 = 0;
    local_c8 = 1;
    local_d0 = 0;
    local_d8 = 1;
    local_e0 = 1;
    local_e8 = 300;
    local_f0 = 300;
    local_f8 = 100;
    local_100 = 100;
    local_108 = 0;
    local_118 = 0;
    local_120 = 1;
    local_a8 = (undefined1 *)&local_128;
    local_a0 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_b0)(local_b0,900,0xa0,200,200,"D4")
    ;
    _i[local_18].d4 = local_a0;
    Am_Style::~Am_Style(local_20);
  }
  printf("Type a new name for the blue window: ");
  __isoc99_scanf("%s",local_98);
  getchar();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    (**(code **)(*(long *)_i[local_18].d4 + 0x40))(_i[local_18].d4,local_98);
  }
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    strcat(local_98," Icon");
    (**(code **)(*(long *)_i[local_18].d4 + 0x48))(_i[local_18].d4,local_98);
    (**(code **)(*(long *)_i[local_18].d4 + 0xa0))();
  }
  return;
}

Assistant:

void
testwin4(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up blue user-positioned window:");
  //getchar();

  int i;
  for (i = 0; i < ar_len; i++) {
    wins_ar[i].d4 = (wins_ar[i].root)
                        ->Create(TESTWINPROPS_D4_LEFT, TESTWINPROPS_D4_TOP, 200,
                                 200, "D4", "D4 Icon", true, false, blue, false,
                                 // Min width and height
                                 100, 100,
                                 // Max width and height
                                 300, 300,
                                 // Want a title bar
                                 true,
                                 // Query user for position
                                 true);
  }

  //  printf("Hit RETURN to change the title of the blue window: ");
  //  getchar ();
  //  char new_title[17];
  //  new_title = "Blue Window";

  char new_title[100];
  printf("Type a new name for the blue window: ");
  scanf("%s", new_title);
  getchar(); // Eat carriage return

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d4)->Set_Title(new_title);
  }
  for (i = 0; i < ar_len; i++) {
    strcat(new_title, " Icon");
    (wins_ar[i].d4)->Set_Icon_Title(new_title);
    (wins_ar[i].d4)->Flush_Output();
  }
}